

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O1

M44f * anon_unknown.dwarf_5d914::matrixEulerMatrix_1
                 (M44f *__return_storage_ptr__,M44f *M,Order order)

{
  byte bVar1;
  V3f f;
  Vec3<float> local_30;
  Euler<float> local_20;
  
  if (order == Default) {
    Imath_3_2::extractEulerXYZ<float>(M,&local_30);
  }
  else {
    Imath_3_2::extractEulerZYX<float>(M,&local_30);
  }
  bVar1 = 0x10;
  if ((order >> 0xd & 1) == 0) {
    bVar1 = (byte)(order >> 9) & 8;
  }
  local_20._12_1_ =
       (byte)order >> 3 & 2 | (byte)order & 1 | (byte)(order >> 6) & 4 | bVar1 |
       local_20._12_1_ & 0xe0;
  local_20.super_Vec3<float>.x = local_30.x;
  local_20.super_Vec3<float>.y = local_30.y;
  local_20.super_Vec3<float>.z = local_30.z;
  Imath_3_2::Euler<float>::toMatrix44(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

M44f
matrixEulerMatrix_1 (const M44f& M, Eulerf::Order order)
{
    V3f f;

    if (order == Eulerf::XYZ)
        extractEulerXYZ (M, f);
    else
        extractEulerZYX (M, f);

    return Eulerf (f, order).toMatrix44 ();
}